

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O2

void strings_equal<char>(string *n_original,string *iexpected,locale *l,string *domain)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  runtime_error *prVar7;
  size_t __n;
  string *__n_00;
  void *__buf;
  void *__buf_00;
  locale tmp_locale;
  allocator local_2c9;
  string_type tmp;
  string_type original;
  locale local_288;
  string_type expected;
  undefined1 local_260 [32];
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  locale local_1e0;
  locale local_1d8;
  locale local_1d0;
  locale local_1c8;
  locale local_1c0;
  locale local_1b8;
  locale local_1b0;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  
  std::locale::locale(&local_288,l);
  to_correct_string<char>(&expected,iexpected,&local_288);
  std::locale::~locale(&local_288);
  std::__cxx11::string::string((string *)&ss,(n_original->_M_dataplus)._M_p,(allocator *)local_260);
  to<char>(&original,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  bVar3 = std::operator==(domain,"default");
  if (bVar3) {
    test_counter = test_counter + 1;
    booster::locale::basic_message<char>::basic_message((basic_message<char> *)&ss,&original);
    booster::locale::basic_message<char>::str_abi_cxx11_
              ((string_type *)local_260,(basic_message<char> *)&ss,l);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_260,&expected);
    std::__cxx11::string::~string((string *)local_260);
    booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ss);
    if (!_Var4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd7);
      poVar5 = std::operator<<(poVar5," bl::translate(original).str(l)==expected");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar1 = error_counter + 1;
      bVar3 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar7,(string *)&ss);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    _ss = 0;
    __n = 0;
    booster::locale::basic_message<char>::str_abi_cxx11_
              ((string_type *)local_260,(basic_message<char> *)&ss,l);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_260,&expected);
    std::__cxx11::string::~string((string *)local_260);
    booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ss);
    if (!_Var4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd9);
      poVar5 = std::operator<<(poVar5," bl::translate(original_c_str).str(l)==expected");
      std::endl<char,std::char_traits<char>>(poVar5);
      uVar2 = error_counter + 1;
      __n = (size_t)uVar2;
      bVar3 = 0x14 < error_counter;
      error_counter = uVar2;
      if (bVar3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar7,(string *)&ss);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::locale::locale(&tmp_locale);
    std::locale::global(&local_1b0);
    std::locale::~locale(&local_1b0);
    booster::locale::basic_message<char>::basic_message((basic_message<char> *)&ss,&original);
    booster::locale::basic_message<char>::str_abi_cxx11_(&tmp,(basic_message<char> *)&ss);
    booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ss);
    test_counter = test_counter + 1;
    _Var4 = std::operator==(&tmp,&expected);
    if (!_Var4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xdd);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::endl<char,std::char_traits<char>>(poVar5);
      uVar2 = error_counter + 1;
      __n = (size_t)uVar2;
      bVar3 = 0x14 < error_counter;
      error_counter = uVar2;
      if (bVar3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar7,(string *)&ss);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    booster::locale::basic_message<char>::basic_message((basic_message<char> *)&ss,&original);
    booster::locale::basic_message<char>::str_abi_cxx11_
              ((string_type *)local_260,(basic_message<char> *)&ss);
    std::__cxx11::string::operator=((string *)&tmp,(string *)local_260);
    std::__cxx11::string::~string((string *)local_260);
    booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ss);
    test_counter = test_counter + 1;
    _Var4 = std::operator==(&tmp,&expected);
    if (!_Var4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xdf);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::endl<char,std::char_traits<char>>(poVar5);
      uVar2 = error_counter + 1;
      __n = (size_t)uVar2;
      bVar3 = 0x14 < error_counter;
      error_counter = uVar2;
      if (bVar3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar7,(string *)&ss);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::locale::global(&local_1b8);
    std::locale::~locale(&local_1b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::ios::imbue(&local_1c0);
    std::locale::~locale(&local_1c0);
    booster::locale::basic_message<char>::basic_message((basic_message<char> *)local_260,&original);
    booster::locale::basic_message<char>::write((basic_message<char> *)local_260,(int)&ss,__buf,__n)
    ;
    booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_260);
    test_counter = test_counter + 1;
    std::__cxx11::stringbuf::str();
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_260,&expected);
    std::__cxx11::string::~string((string *)local_260);
    if (!_Var4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xe5);
      poVar5 = std::operator<<(poVar5," ss.str()==expected");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar1 = error_counter + 1;
      bVar3 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_260,"Error limits reached, stopping unit test",&local_2c9);
        booster::runtime_error::runtime_error(prVar7,(string *)local_260);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    std::__cxx11::string::~string((string *)&tmp);
    std::locale::~locale(&tmp_locale);
  }
  test_counter = test_counter + 1;
  booster::locale::basic_message<char>::basic_message((basic_message<char> *)&ss,&original);
  __n_00 = domain;
  booster::locale::basic_message<char>::str
            ((string_type *)local_260,(basic_message<char> *)&ss,l,domain);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,&expected);
  std::__cxx11::string::~string((string *)local_260);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ss);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xe7);
    poVar5 = std::operator<<(poVar5," bl::translate(original).str(l,domain)==expected");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar2 = error_counter + 1;
    __n_00 = (string *)(ulong)uVar2;
    bVar3 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
      booster::runtime_error::runtime_error(prVar7,(string *)&ss);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&tmp_locale);
  std::locale::global(&local_1c8);
  std::locale::~locale(&local_1c8);
  test_counter = test_counter + 1;
  booster::locale::basic_message<char>::basic_message((basic_message<char> *)&ss,&original);
  booster::locale::basic_message<char>::str
            ((string_type *)local_260,(basic_message<char> *)&ss,domain);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,&expected);
  std::__cxx11::string::~string((string *)local_260);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&ss);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xea);
    poVar5 = std::operator<<(poVar5," bl::translate(original).str(domain)==expected");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar2 = error_counter + 1;
    __n_00 = (string *)(ulong)uVar2;
    bVar3 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
      booster::runtime_error::runtime_error(prVar7,(string *)&ss);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_1d0);
  std::locale::~locale(&local_1d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::ios::imbue(&local_1d8);
  std::locale::~locale(&local_1d8);
  std::__cxx11::string::string((string *)&tmp,(string *)domain);
  pbVar6 = booster::locale::as::details::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&ss,(set_domain *)&tmp);
  booster::locale::basic_message<char>::basic_message((basic_message<char> *)local_260,&original);
  booster::locale::basic_message<char>::write
            ((basic_message<char> *)local_260,(int)pbVar6,__buf_00,(size_t)__n_00);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_260);
  std::__cxx11::string::~string((string *)&tmp);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,&expected);
  std::__cxx11::string::~string((string *)local_260);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf0);
    poVar5 = std::operator<<(poVar5," ss.str()==expected");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_260,"Error limits reached, stopping unit test",(allocator *)&tmp);
      booster::runtime_error::runtime_error(prVar7,(string *)local_260);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::ios::imbue(&local_1e0);
  std::locale::~locale(&local_1e0);
  std::__cxx11::string::string((string *)&tmp,(string *)domain);
  pbVar6 = booster::locale::as::details::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&ss,(set_domain *)&tmp);
  local_240._M_p = (pointer)&local_230;
  local_260._0_4_ = 0;
  local_260._8_8_ = original._M_dataplus._M_p;
  local_260._16_8_ = 0;
  local_260._24_8_ = 0;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_220._M_p = (pointer)&local_210;
  local_218 = 0;
  local_210._M_local_buf[0] = '\0';
  local_200._M_p = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  booster::locale::basic_message<char>::write
            ((basic_message<char> *)local_260,(int)pbVar6,(void *)0x0,(size_t)local_200._M_p);
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_260);
  std::__cxx11::string::~string((string *)&tmp);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,&expected);
  std::__cxx11::string::~string((string *)local_260);
  if (!_Var4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xf6);
    poVar5 = std::operator<<(poVar5," ss.str()==expected");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_260,"Error limits reached, stopping unit test",(allocator *)&tmp);
      booster::runtime_error::runtime_error(prVar7,(string *)local_260);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  std::locale::~locale(&tmp_locale);
  std::__cxx11::string::~string((string *)&original);
  std::__cxx11::string::~string((string *)&expected);
  return;
}

Assistant:

void strings_equal(std::string n_original,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type original = to<Char>(n_original.c_str());
    if(domain=="default") {
        TEST(bl::translate(original).str(l)==expected);
        Char const *original_c_str=original.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(original_c_str).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(original);
        TEST(tmp==expected);
        tmp=bl::translate(original).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(original);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(original).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(original).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(original);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(original.c_str());
        TEST(ss.str()==expected);
    }
}